

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O3

void asmjit::vMemMgrReset(VMemMgr *self,bool keepVirtualMemory)

{
  MemNode *pMVar1;
  MemNode *__ptr;
  
  __ptr = self->_first;
  while (__ptr != (MemNode *)0x0) {
    pMVar1 = __ptr->next;
    if (!keepVirtualMemory) {
      OSUtils::releaseVirtualMemory((__ptr->super_RbNode).mem,__ptr->size);
    }
    free(__ptr->baUsed);
    free(__ptr);
    __ptr = pMVar1;
  }
  self->_root = (MemNode *)0x0;
  self->_first = (MemNode *)0x0;
  self->_last = (MemNode *)0x0;
  self->_optimal = (MemNode *)0x0;
  self->_allocatedBytes = 0;
  self->_usedBytes = 0;
  self->_root = (MemNode *)0x0;
  self->_first = (MemNode *)0x0;
  return;
}

Assistant:

static void vMemMgrReset(VMemMgr* self, bool keepVirtualMemory) noexcept {
  MemNode* node = self->_first;

  while (node) {
    MemNode* next = node->next;

    if (!keepVirtualMemory)
      vMemMgrReleaseVMem(self, node->mem, node->size);

    Internal::releaseMemory(node->baUsed);
    Internal::releaseMemory(node);

    node = next;
  }

  self->_allocatedBytes = 0;
  self->_usedBytes = 0;

  self->_root = nullptr;
  self->_first = nullptr;
  self->_last = nullptr;
  self->_optimal = nullptr;
}